

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_estimateSubBlockSize_literal
                 (BYTE *literals,size_t litSize,ZSTD_hufCTables_t *huf,
                 ZSTD_hufCTablesMetadata_t *hufMetadata,void *workspace,size_t wkspSize,
                 int writeEntropy)

{
  uint uVar1;
  size_t code;
  size_t local_68;
  size_t cLitSizeEstimate;
  size_t largest;
  size_t literalSectionHeaderSize;
  uint *puStack_48;
  uint maxSymbolValue;
  uint *countWksp;
  size_t wkspSize_local;
  void *workspace_local;
  ZSTD_hufCTablesMetadata_t *hufMetadata_local;
  ZSTD_hufCTables_t *huf_local;
  size_t litSize_local;
  BYTE *literals_local;
  
  literalSectionHeaderSize._4_4_ = 0xff;
  literals_local = (BYTE *)litSize;
  if (hufMetadata->hType != set_basic) {
    if (hufMetadata->hType == set_rle) {
      literals_local = (BYTE *)0x1;
    }
    else {
      puStack_48 = (uint *)workspace;
      countWksp = (uint *)wkspSize;
      wkspSize_local = (size_t)workspace;
      workspace_local = hufMetadata;
      hufMetadata_local = (ZSTD_hufCTablesMetadata_t *)huf;
      huf_local = (ZSTD_hufCTables_t *)litSize;
      litSize_local = (size_t)literals;
      if (hufMetadata->hType != set_compressed) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x277b,
                      "size_t ZSTD_estimateSubBlockSize_literal(const BYTE *, size_t, const ZSTD_hufCTables_t *, const ZSTD_hufCTablesMetadata_t *, void *, size_t, int)"
                     );
      }
      code = HIST_count_wksp((uint *)workspace,(uint *)((long)&literalSectionHeaderSize + 4),
                             literals,litSize,workspace,wkspSize);
      uVar1 = ZSTD_isError(code);
      if (uVar1 == 0) {
        local_68 = HUF_estimateCompressedSize
                             ((HUF_CElt *)hufMetadata_local,puStack_48,
                              literalSectionHeaderSize._4_4_);
        if (writeEntropy != 0) {
          local_68 = *(long *)((long)workspace_local + 0x1f8) + local_68;
        }
        literals_local = (BYTE *)(local_68 + 3);
      }
      else {
        literals_local = (BYTE *)huf_local;
      }
    }
  }
  return (size_t)literals_local;
}

Assistant:

static size_t ZSTD_estimateSubBlockSize_literal(const BYTE* literals, size_t litSize,
                                                const ZSTD_hufCTables_t* huf,
                                                const ZSTD_hufCTablesMetadata_t* hufMetadata,
                                                void* workspace, size_t wkspSize,
                                                int writeEntropy)
{
    unsigned* const countWksp = (unsigned*)workspace;
    unsigned maxSymbolValue = 255;
    size_t literalSectionHeaderSize = 3; /* Use hard coded size of 3 bytes */

    if (hufMetadata->hType == set_basic) return litSize;
    else if (hufMetadata->hType == set_rle) return 1;
    else if (hufMetadata->hType == set_compressed) {
        size_t const largest = HIST_count_wksp (countWksp, &maxSymbolValue, (const BYTE*)literals, litSize, workspace, wkspSize);
        if (ZSTD_isError(largest)) return litSize;
        {   size_t cLitSizeEstimate = HUF_estimateCompressedSize((const HUF_CElt*)huf->CTable, countWksp, maxSymbolValue);
            if (writeEntropy) cLitSizeEstimate += hufMetadata->hufDesSize;
            return cLitSizeEstimate + literalSectionHeaderSize;
    }   }
    assert(0); /* impossible */
    return 0;
}